

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O1

void __thiscall WorkSpace::status(WorkSpace *this)

{
  pointer pJVar1;
  ostream *poVar2;
  ulong uVar3;
  pointer pPVar4;
  pointer pLVar5;
  pointer pLVar6;
  ulong uVar7;
  JournalOperation *j;
  pointer this_00;
  long lVar8;
  
  pJVar1 = (this->journal).super__Vector_base<JournalOperation,_std::allocator<JournalOperation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->journal).
                 super__Vector_base<JournalOperation,_std::allocator<JournalOperation>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pJVar1; this_00 = this_00 + 1) {
    JournalOperation::status(this_00);
  }
  SequenceDistanceGraph::print_status(&this->sdg);
  poVar2 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Workspace contains ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," paired reads datastores",0x18);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pPVar4 = (this->paired_reads_datastores).
           super__Vector_base<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->paired_reads_datastores).
      super__Vector_base<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      PairedReadsDatastore::print_status
                ((PairedReadsDatastore *)((long)&(pPVar4->filename)._M_dataplus._M_p + lVar8));
      uVar7 = uVar7 + 1;
      pPVar4 = (this->paired_reads_datastores).
               super__Vector_base<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->paired_reads_datastores).
                     super__Vector_base<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
              0x51b3bea3677d46cf;
      lVar8 = lVar8 + 0x178;
    } while (uVar7 <= uVar3 && uVar3 - uVar7 != 0);
  }
  poVar2 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Workspace contains ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," linked reads datastores",0x18);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pLVar5 = (this->linked_reads_datastores).
           super__Vector_base<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->linked_reads_datastores).
      super__Vector_base<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar5) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      LinkedReadsDatastore::print_status
                ((LinkedReadsDatastore *)((long)&(pLVar5->filename)._M_dataplus._M_p + lVar8));
      uVar7 = uVar7 + 1;
      pLVar5 = (this->linked_reads_datastores).
               super__Vector_base<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->linked_reads_datastores).
                     super__Vector_base<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar5 >> 3) *
              0x6f96f96f96f96f97;
      lVar8 = lVar8 + 0x138;
    } while (uVar7 <= uVar3 && uVar3 - uVar7 != 0);
  }
  poVar2 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Workspace contains ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," long reads datastores",0x16);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pLVar6 = (this->long_reads_datastores).
           super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->long_reads_datastores).
      super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar6) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      LongReadsDatastore::print_status((LongReadsDatastore *)((long)&pLVar6->ws + lVar8));
      uVar7 = uVar7 + 1;
      pLVar6 = (this->long_reads_datastores).
               super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->long_reads_datastores).
                     super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pLVar6 >> 3) *
              -0x7d05f417d05f417d;
      lVar8 = lVar8 + 0x158;
    } while (uVar7 <= uVar3 && uVar3 - uVar7 != 0);
  }
  return;
}

Assistant:

void WorkSpace::status() {
    for (const auto &j:journal){
        j.status();
    }
    //graph
    sdg.print_status();

    //PR datastores and mappings
    sdglib::OutputLog()<<"Workspace contains "<< paired_reads_datastores.size() << " paired reads datastores" <<std::endl;
    for (auto di=0;di<paired_reads_datastores.size();++di){
        paired_reads_datastores[di].print_status();

    }
    //10x datastores and mappings
    sdglib::OutputLog()<<"Workspace contains "<< linked_reads_datastores.size() << " linked reads datastores" <<std::endl;
    for (auto di=0;di<linked_reads_datastores.size();++di){
        linked_reads_datastores[di].print_status();
    }
    //LR datastores and mappings
    sdglib::OutputLog()<<"Workspace contains "<< long_reads_datastores.size() << " long reads datastores" <<std::endl;
    for (auto di=0;di<long_reads_datastores.size();++di){
        long_reads_datastores[di].print_status();
    }

}